

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O1

int mbedtls_ecp_point_read_binary
              (mbedtls_ecp_group *grp,mbedtls_ecp_point *pt,uchar *buf,size_t ilen)

{
  byte bVar1;
  int iVar2;
  size_t buflen;
  
  if (ilen != 0) {
    buflen = mbedtls_mpi_size(&grp->P);
    if ((grp->G).X.p == (mbedtls_mpi_uint *)0x0) {
      return -0x4e80;
    }
    if ((grp->G).Y.p == (mbedtls_mpi_uint *)0x0) {
      return -0x4e80;
    }
    if (*buf == '\0') {
      if (ilen != 1) {
        return -0x4f80;
      }
      iVar2 = mbedtls_ecp_set_zero(pt);
      return iVar2;
    }
    if (buflen + 1 <= ilen) {
      iVar2 = mbedtls_mpi_read_binary(&pt->X,buf + 1,buflen);
      if (iVar2 != 0) {
        return iVar2;
      }
      iVar2 = mbedtls_mpi_lset(&pt->Z,1);
      if (iVar2 != 0) {
        return iVar2;
      }
      bVar1 = *buf;
      if (bVar1 - 2 < 2) {
        if (buflen + 1 != ilen) {
          return -0x4f80;
        }
        iVar2 = mbedtls_ecp_sw_derive_y(grp,&pt->X,&pt->Y,bVar1 & 1);
        return iVar2;
      }
      if (bVar1 == 4) {
        if (buflen * 2 + 1 != ilen) {
          return -0x4f80;
        }
        iVar2 = mbedtls_mpi_read_binary(&pt->Y,buf + 1 + buflen,buflen);
        return iVar2;
      }
    }
  }
  return -0x4f80;
}

Assistant:

int mbedtls_ecp_point_read_binary(const mbedtls_ecp_group *grp,
                                  mbedtls_ecp_point *pt,
                                  const unsigned char *buf, size_t ilen)
{
    int ret = MBEDTLS_ERR_ECP_FEATURE_UNAVAILABLE;
    size_t plen;
    if (ilen < 1) {
        return MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
    }

    plen = mbedtls_mpi_size(&grp->P);

#if defined(MBEDTLS_ECP_MONTGOMERY_ENABLED)
    if (mbedtls_ecp_get_type(grp) == MBEDTLS_ECP_TYPE_MONTGOMERY) {
        if (plen != ilen) {
            return MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
        }

        MBEDTLS_MPI_CHK(mbedtls_mpi_read_binary_le(&pt->X, buf, plen));
        mbedtls_mpi_free(&pt->Y);

        if (grp->id == MBEDTLS_ECP_DP_CURVE25519) {
            /* Set most significant bit to 0 as prescribed in RFC7748 §5 */
            MBEDTLS_MPI_CHK(mbedtls_mpi_set_bit(&pt->X, plen * 8 - 1, 0));
        }

        MBEDTLS_MPI_CHK(mbedtls_mpi_lset(&pt->Z, 1));
    }
#endif
#if defined(MBEDTLS_ECP_SHORT_WEIERSTRASS_ENABLED)
    if (mbedtls_ecp_get_type(grp) == MBEDTLS_ECP_TYPE_SHORT_WEIERSTRASS) {
        if (buf[0] == 0x00) {
            if (ilen == 1) {
                return mbedtls_ecp_set_zero(pt);
            } else {
                return MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
            }
        }

        if (ilen < 1 + plen) {
            return MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
        }

        MBEDTLS_MPI_CHK(mbedtls_mpi_read_binary(&pt->X, buf + 1, plen));
        MBEDTLS_MPI_CHK(mbedtls_mpi_lset(&pt->Z, 1));

        if (buf[0] == 0x04) {
            /* format == MBEDTLS_ECP_PF_UNCOMPRESSED */
            if (ilen != 1 + plen * 2) {
                return MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
            }
            return mbedtls_mpi_read_binary(&pt->Y, buf + 1 + plen, plen);
        } else if (buf[0] == 0x02 || buf[0] == 0x03) {
            /* format == MBEDTLS_ECP_PF_COMPRESSED */
            if (ilen != 1 + plen) {
                return MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
            }
            return mbedtls_ecp_sw_derive_y(grp, &pt->X, &pt->Y,
                                           (buf[0] & 1));
        } else {
            return MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
        }
    }
#endif

cleanup:
    return ret;
}